

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

string * __thiscall
chrono::ChValueSpecific<myEmployee>::GetClassRegisteredName_abi_cxx11_
          (ChValueSpecific<myEmployee> *this)

{
  myEmployee *pmVar1;
  int iVar2;
  ChException *anon_var_0;
  allocator local_19;
  ChValueSpecific<myEmployee> *local_18;
  ChValueSpecific<myEmployee> *this_local;
  
  local_18 = this;
  if (GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_);
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_,"",&local_19);
      std::allocator<char>::~allocator((allocator<char> *)&local_19);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_);
    }
  }
  if (this->_ptr_to_val == (myEmployee *)0x0) {
    this_local = (ChValueSpecific<myEmployee> *)
                 &GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_;
  }
  else {
    pmVar1 = this->_ptr_to_val;
    if (pmVar1 == (myEmployee *)0x0) {
      __cxa_bad_typeid();
    }
    this_local = (ChValueSpecific<myEmployee> *)
                 ChClassFactory::GetClassTagName_abi_cxx11_
                           ((type_info *)pmVar1->_vptr_myEmployee[-1]);
  }
  return (string *)this_local;
}

Assistant:

virtual std::string& GetClassRegisteredName() {
          static std::string nostring("");
          if (!_ptr_to_val) {
              return nostring;
          }
          try {
              return ChClassFactory::GetClassTagName(typeid(*_ptr_to_val));
          }catch (const ChException &) {
              return nostring;
          }
        }